

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver_manager.cpp
# Opt level: O2

AdbcStatusCode
AdbcConnectionSetOptionDouble(AdbcConnection *connection,char *key,double value,AdbcError *error)

{
  void *pvVar1;
  AdbcStatusCode AVar2;
  mapped_type *pmVar3;
  allocator local_39;
  double local_38;
  string local_30;
  
  pvVar1 = connection->private_data;
  local_38 = value;
  if (pvVar1 == (void *)0x0) {
    std::__cxx11::string::string
              ((string *)&local_30,"AdbcConnectionSetOptionDouble: must AdbcConnectionNew first",
               &local_39);
    SetError(error,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    AVar2 = '\x06';
  }
  else {
    if (connection->private_driver != (AdbcDriver *)0x0) {
      AVar2 = (*connection->private_driver->ConnectionSetOptionDouble)(connection,key,value,error);
      return AVar2;
    }
    std::__cxx11::string::string((string *)&local_30,key,&local_39);
    pmVar3 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)((long)pvVar1 + 0xa8),&local_30);
    *pmVar3 = local_38;
    std::__cxx11::string::~string((string *)&local_30);
    AVar2 = '\0';
  }
  return AVar2;
}

Assistant:

AdbcStatusCode AdbcConnectionSetOptionDouble(struct AdbcConnection *connection, const char *key, double value,
                                             struct AdbcError *error) {
	if (!connection->private_data) {
		SetError(error, "AdbcConnectionSetOptionDouble: must AdbcConnectionNew first");
		return ADBC_STATUS_INVALID_STATE;
	}
	if (!connection->private_driver) {
		// Init not yet called, save the option
		TempConnection *args = reinterpret_cast<TempConnection *>(connection->private_data);
		args->double_options[key] = value;
		return ADBC_STATUS_OK;
	}
	INIT_ERROR(error, connection);
	return connection->private_driver->ConnectionSetOptionDouble(connection, key, value, error);
}